

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr_test.cc
# Opt level: O1

void basic_test(fdb_encryption_algorithm_t encryption)

{
  filemgr_ops *pfVar1;
  filemgr *file;
  filemgr_open_result fVar2;
  timeval __test_begin;
  filemgr_config config;
  char buf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  config.flag = 0;
  config.chunksize = 0;
  config.prefetch_duration = 0;
  config.block_reusing_threshold.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  config.num_keeping_headers.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  config.do_not_cache_doc_blocks = false;
  config._89_3_ = 0;
  config.num_blocks_readahead = 0;
  config.blocksize = 0x1000;
  config.ncacheblock = 0x400;
  config.options = '\b';
  config.seqtree_opt = '\0';
  config._18_6_ = 0;
  config.encryption_key.algorithm = encryption;
  config.num_wal_shards = 8;
  config.num_bcache_shards = 0;
  builtin_memcpy(config.encryption_key.bytes,"UUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUU",0x20);
  pfVar1 = get_filemgr_ops();
  filemgr_open("./filemgr_testfile",pfVar1,&config,(err_log_callback *)0x0);
  pfVar1 = get_filemgr_ops();
  fVar2 = filemgr_open("./filemgr_testfile",pfVar1,&config,(err_log_callback *)0x0);
  filemgr_update_header(fVar2.file,"dbheader",9,true);
  filemgr_close(fVar2.file,true,(char *)0x0,(err_log_callback *)0x0);
  pfVar1 = get_filemgr_ops();
  fVar2 = filemgr_open("./filemgr_testfile",pfVar1,&config,(err_log_callback *)0x0);
  file = fVar2.file;
  memcpy(buf,(file->header).data,(ulong)(file->header).size);
  puts(buf);
  filemgr_update_header(file,"dbheader2222222222",0x13,true);
  filemgr_close(file,true,(char *)0x0,(err_log_callback *)0x0);
  sprintf(buf,"basic test, encryption=%d",encryption);
  fprintf(_stderr,"%s PASSED\n",buf);
  return;
}

Assistant:

void basic_test(fdb_encryption_algorithm_t encryption)
{
    TEST_INIT();

    struct filemgr *file;
    struct filemgr_config config;
    const char *dbheader = "dbheader";
    const char *dbheader2 = "dbheader2222222222";
    char buf[256];

    memset(&config, 0, sizeof(config));
    config.blocksize = 4096;
    config.ncacheblock = 1024;
    config.options = FILEMGR_CREATE;
    config.num_wal_shards = 8;

    config.encryption_key.algorithm = encryption;
    memset(&config.encryption_key.bytes, 0x55, sizeof(config.encryption_key.bytes));

    filemgr_open_result result = filemgr_open((char *) "./filemgr_testfile",
                                              get_filemgr_ops(), &config, NULL);
    result = filemgr_open((char *) "./filemgr_testfile", get_filemgr_ops(), &config, NULL);
    file = result.file;

    filemgr_update_header(file, (void*)dbheader, strlen(dbheader)+1, true);

    filemgr_close(file, true, NULL, NULL);
    result = filemgr_open((char *) "./filemgr_testfile", get_filemgr_ops(), &config, NULL);
    file = result.file;

    memcpy(buf, file->header.data, file->header.size);
    printf("%s\n", buf);

    filemgr_update_header(file, (void*)dbheader2, strlen(dbheader2) + 1, true);

    filemgr_close(file, true, NULL, NULL);

    sprintf(buf, "basic test, encryption=%d", (int)encryption);
    TEST_RESULT(buf);
}